

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O2

cTValue * str2num(cTValue *o,TValue *n)

{
  int iVar1;
  
  if ((0xfffefffe < (o->field_2).it) &&
     (((o->field_2).it != 0xfffffffb ||
      (iVar1 = lj_strscan_num((GCstr *)(ulong)(o->u32).lo,n), o = n, iVar1 == 0)))) {
    o = (cTValue *)0x0;
  }
  return o;
}

Assistant:

static cTValue *str2num(cTValue *o, TValue *n)
{
  if (tvisnum(o))
    return o;
  else if (tvisint(o))
    return (setnumV(n, (lua_Number)intV(o)), n);
  else if (tvisstr(o) && lj_strscan_num(strV(o), n))
    return n;
  else
    return NULL;
}